

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

_Bool cfg_is_allowed_key(char *key)

{
  size_t sVar1;
  char *key_local;
  
  if ((*key < '0') || ('9' < *key)) {
    sVar1 = strspn(key,cfg_is_allowed_key::valid);
    key_local._7_1_ = key[sVar1] == '\0';
  }
  else {
    key_local._7_1_ = false;
  }
  return key_local._7_1_;
}

Assistant:

bool
cfg_is_allowed_key(const char *key) {
  static const char *valid = "_0123456789"
                             "abcdefghijklmnopqrstuvwxyz"
                             "ABCDEFGHIJKLMNOPQRSTUVWXYZ";
  /* test for [a-zA-Z_][a-zA-Z0-9_]* */
  if (*key >= '0' && *key <= '9') {
    return false;
  }

  return key[strspn(key, valid)] == 0;
}